

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

FOTerm * __thiscall
FOTerm::functor(FOTerm *__return_storage_ptr__,FOTerm *this,string *fname,
               initializer_list<FOTerm> params)

{
  (__return_storage_ptr__->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  if ((byte)(*(char *)&(((this->params).super__Vector_base<FOTerm,_std::allocator<FOTerm>_>._M_impl.
                         super__Vector_impl_data._M_start)->params).
                       super__Vector_base<FOTerm,_std::allocator<FOTerm>_> + 0x9fU) < 0x1a) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
    __return_storage_ptr__->tag = Functor;
    std::vector<FOTerm,std::allocator<FOTerm>>::_M_assign_aux<FOTerm_const*>
              ((vector<FOTerm,std::allocator<FOTerm>> *)__return_storage_ptr__,fname,
               fname + (long)params._M_array * 2);
    return __return_storage_ptr__;
  }
  __assert_fail("fname[0] >= \'a\' && fname[0] <= \'z\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x18b,"static FOTerm FOTerm::functor(std::string, std::initializer_list<FOTerm>)");
}

Assistant:

static FOTerm functor(std::string fname,
                          std::initializer_list<FOTerm> params) {
        FOTerm t;
        // should be small letter
        assert(fname[0] >= 'a' && fname[0] <= 'z');
        t.name = fname;
        t.tag = FOTermTag::Functor;
        t.params = params;
        return t;
    }